

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O2

void printFlagBits(uint32_t flags,_func_char_ptr_uint32_t__Bool *toStringFn)

{
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  uint32_t bit_index;
  uint uVar4;
  uint8_t *puVar5;
  
  bVar2 = true;
  for (uVar4 = 0; uVar4 != 0x20; uVar4 = uVar4 + 1) {
    uVar3 = 1 << ((byte)uVar4 & 0x1f);
    puVar5 = ", ";
    if (bVar2) {
      puVar5 = "";
    }
    pcVar1 = (*toStringFn)(uVar4,(flags >> (uVar4 & 0x1f) & 1) != 0);
    if (pcVar1 == (char *)0x0) {
      if ((uVar3 & flags) != 0) {
        bVar2 = false;
        printf("%s%u",puVar5,(ulong)uVar3);
      }
    }
    else {
      bVar2 = false;
      printf("%s%s",puVar5,pcVar1);
    }
  }
  return;
}

Assistant:

static void printFlagBits(uint32_t flags, const char*(*toStringFn)(uint32_t, bool)) {
    bool first = true;
    for (uint32_t bit_index = 0; bit_index < 32; ++bit_index) {
        uint32_t bit_mask = 1u << bit_index;
        bool bit_value = (bit_mask & (uint32_t) flags) != 0;

        const char* comma = first ? "" : ", ";
        const char* str = toStringFn(bit_index, bit_value);
        if (str) {
            printf("%s%s", comma, str);
            first = false;
        } else if (bit_value) {
            printf("%s%u", comma, bit_mask);
            first = false;
        }
    }
}